

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

long GetStreamWriteAvailable(PaStream *s)

{
  int iVar1;
  ulong uVar2;
  pthread_t __thread1;
  char *pcVar3;
  int __pa_unsure_error_id;
  int xrun;
  unsigned_long avail;
  
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)((long)s + 0x308),&avail,&xrun);
  if (paUtilErr_ < 0) {
    pcVar3 = 
    "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4534\n"
    ;
  }
  else {
    if (xrun == 0) {
      return avail;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)s);
    if (-1 < paUtilErr_) {
      uVar2 = snd_pcm_avail_update(*(undefined8 *)((long)s + 0x340));
      if (-1 < (int)uVar2) {
        return uVar2;
      }
      __thread1 = pthread_self();
      iVar1 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar1 != 0) {
        pcVar3 = (char *)snd_strerror(uVar2 & 0xffffffff);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)(int)uVar2,pcVar3);
      }
      PaUtil_DebugPrint(
                       "Expression \'savail\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4543\n"
                       );
      iVar1 = -9999;
      goto LAB_0010d5f5;
    }
    pcVar3 = 
    "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4539\n"
    ;
  }
  PaUtil_DebugPrint(pcVar3);
  iVar1 = paUtilErr_;
LAB_0010d5f5:
  return (long)iVar1;
}

Assistant:

static signed long GetStreamWriteAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun ) );
    if( xrun )
    {
        snd_pcm_sframes_t savail;

        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        savail = alsa_snd_pcm_avail_update( stream->playback.pcm );

        /* savail should not contain -EPIPE now, since PaAlsaStream_HandleXrun will only prepare the pcm */
        ENSURE_( savail, paUnanticipatedHostError );

        avail = (unsigned long) savail;
    }

    return (signed long)avail;

error:
    return result;
}